

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternStreamable(xmlPatternPtr comp)

{
  if (comp == (xmlPatternPtr)0x0) {
    return -1;
  }
  do {
    if (comp->stream == (xmlStreamCompPtr)0x0) {
      return 0;
    }
    comp = comp->next;
  } while (comp != (_xmlPattern *)0x0);
  return 1;
}

Assistant:

int
xmlPatternStreamable(xmlPatternPtr comp) {
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(0);
	comp = comp->next;
    }
    return(1);
}